

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int xptrDocTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  glob_t globbuf;
  char pattern [500];
  char result [500];
  
  xpathDocument = (xmlDocPtr)xmlReadFile(filename,0,10,CONCAT44(in_register_0000000c,options));
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
    iVar1 = -1;
  }
  else {
    pcVar3 = baseFilename(filename);
    iVar1 = snprintf(pattern,499,"./test/XPath/xptr/%s*",pcVar3);
    if (0x1f2 < iVar1) {
      pattern[499] = '\0';
    }
    globbuf.gl_offs = 0;
    glob64(pattern,8,(__errfunc *)0x0,(glob64_t *)&globbuf);
    iVar1 = 0;
    for (uVar4 = 0; uVar4 < globbuf.gl_pathc; uVar4 = uVar4 + 1) {
      baseFilename(globbuf.gl_pathv[uVar4]);
      iVar2 = snprintf(result,499,"result/XPath/xptr/%s");
      if (0x1f2 < iVar2) {
        result[499] = '\0';
      }
      iVar2 = xpathCommonTest(globbuf.gl_pathv[uVar4],result,1,0);
      if (iVar2 != 0) {
        iVar1 = iVar2;
      }
    }
    globfree64((glob64_t *)&globbuf);
    xmlFreeDoc(xpathDocument);
  }
  return iVar1;
}

Assistant:

static int
xptrDocTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options ATTRIBUTE_UNUSED) {

    char pattern[500];
    char result[500];
    glob_t globbuf;
    size_t i;
    int ret = 0, res;

    xpathDocument = xmlReadFile(filename, NULL,
                                XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    res = snprintf(pattern, 499, "./test/XPath/xptr/%s*",
                   baseFilename(filename));
    if (res >= 499)
        pattern[499] = 0;
    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        res = snprintf(result, 499, "result/XPath/xptr/%s",
	               baseFilename(globbuf.gl_pathv[i]));
        if (res >= 499)
            result[499] = 0;
	res = xpathCommonTest(globbuf.gl_pathv[i], &result[0], 1, 0);
	if (res != 0)
	    ret = res;
    }
    globfree(&globbuf);

    xmlFreeDoc(xpathDocument);
    return(ret);
}